

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O2

string * GetUnit_abi_cxx11_(string *__return_storage_ptr__,U8 *pItem)

{
  uint uVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  uVar1 = *(uint *)(pItem + 1);
  if ((uVar1 & 0xf0) == 0) {
    if ((uVar1 & 0xf00) == 0) {
      if ((uVar1 & 0xf000) != 0) {
        pcVar3 = "Second";
        paVar2 = &local_f;
        goto LAB_0012ca98;
      }
      if ((uVar1 & 0xf0000) == 0) {
        if ((uVar1 & 0xf00000) != 0) {
          pcVar3 = "Ampere";
          paVar2 = &local_12;
          goto LAB_0012ca98;
        }
        if ((uVar1 & 0xf000000) != 0) {
          pcVar3 = "Candela";
          paVar2 = &local_13;
          goto LAB_0012ca98;
        }
      }
      else {
        if ((uVar1 & 0xf) - 1 < 2) {
          pcVar3 = "Kelvin";
          paVar2 = &local_10;
          goto LAB_0012ca98;
        }
        if ((uVar1 & 0xf) - 3 < 2) {
          pcVar3 = "Fahrenheit";
          paVar2 = &local_11;
          goto LAB_0012ca98;
        }
      }
    }
    else {
      if ((uVar1 & 0xf) - 1 < 2) {
        pcVar3 = "Gram";
        paVar2 = &local_d;
        goto LAB_0012ca98;
      }
      if ((uVar1 & 0xf) - 3 < 2) {
        pcVar3 = "Slug";
        paVar2 = &local_e;
        goto LAB_0012ca98;
      }
    }
switchD_0012c997_default:
    pcVar3 = "Undefined Unit";
    paVar2 = &local_14;
  }
  else {
    switch(uVar1 & 0xf) {
    case 1:
      pcVar3 = "Centimeter";
      paVar2 = &local_9;
      break;
    case 2:
      pcVar3 = "Radian";
      paVar2 = &local_a;
      break;
    case 3:
      pcVar3 = "Inch";
      paVar2 = &local_b;
      break;
    case 4:
      pcVar3 = "Degree";
      paVar2 = &local_c;
      break;
    default:
      goto switchD_0012c997_default;
    }
  }
LAB_0012ca98:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GetUnit( const U8* pItem )
{
    U32 val = *( U32* )( pItem + 1 );

    U8 firstNibble = val & 0x0f;

    // branch by quality measures
    if( val & 0x000000f0 ) // Length
    {
        switch( firstNibble )
        {
        case 1:
            return "Centimeter";
        case 2:
            return "Radian";
        case 3:
            return "Inch";
        case 4:
            return "Degree";
        }
    }
    else if( val & 0x00000f00 )
    { // Mass

        if( firstNibble == 1 || firstNibble == 2 )
            return "Gram";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Slug";
    }
    else if( val & 0x0000f000 )
    { // Time

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Second";
    }
    else if( val & 0x000f0000 )
    { // Temperature

        if( firstNibble == 1 || firstNibble == 2 )
            return "Kelvin";
        else if( firstNibble == 3 || firstNibble == 4 )
            return "Fahrenheit";
    }
    else if( val & 0x00f00000 )
    { // Current

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Ampere";
    }
    else if( val & 0x0f000000 )
    { // Luminosity

        if( firstNibble >= 1 || firstNibble <= 4 )
            return "Candela";
    }

    return "Undefined Unit";
}